

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

void __thiscall
pbrt::HaltonSampler::StartPixelSample(HaltonSampler *this,Point2i *p,int sampleIndex,int dim)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint64_t uVar5;
  long lVar6;
  int i;
  long lVar7;
  uint uVar8;
  
  this->haltonIndex = 0;
  uVar8 = (this->baseScales).super_Tuple2<pbrt::Point2,_int>.y *
          (this->baseScales).super_Tuple2<pbrt::Point2,_int>.x;
  if (1 < (int)uVar8) {
    uVar2 = (p->super_Tuple2<pbrt::Point2,_int>).x;
    uVar3 = (p->super_Tuple2<pbrt::Point2,_int>).y;
    lVar6 = 0;
    lVar7 = 0;
    do {
      if (lVar7 == 0) {
        uVar5 = InverseRadicalInverse
                          ((ulong)(uVar2 & 0x7f),2,
                           (this->baseExponents).super_Tuple2<pbrt::Point2,_int>.x);
        lVar6 = 0;
      }
      else {
        if (lVar7 == 2) goto LAB_0022a813;
        uVar5 = InverseRadicalInverse
                          ((ulong)(uVar3 & 0x7f),3,
                           (this->baseExponents).super_Tuple2<pbrt::Point2,_int>.y);
        lVar6 = 4;
      }
      piVar1 = this->multInverse + lVar7;
      lVar7 = lVar7 + 1;
      lVar6 = (long)*piVar1 * uVar5 *
              (long)((int)uVar8 / *(int *)((long)this->multInverse + lVar6 + -0x10)) +
              this->haltonIndex;
      this->haltonIndex = lVar6;
    } while( true );
  }
  lVar6 = 0;
LAB_0022a822:
  this->haltonIndex = (int)(uVar8 * sampleIndex) + lVar6;
  iVar4 = 2;
  if (2 < dim) {
    iVar4 = dim;
  }
  this->dimension = iVar4;
  return;
LAB_0022a813:
  lVar6 = lVar6 % (long)(ulong)uVar8;
  goto LAB_0022a822;
}

Assistant:

PBRT_CPU_GPU
    void StartPixelSample(const Point2i &p, int sampleIndex, int dim) {
        haltonIndex = 0;
        int sampleStride = baseScales[0] * baseScales[1];
        // Compute Halton sample offset for first sample in pixel _p_
        if (sampleStride > 1) {
            Point2i pm(Mod(p[0], MaxHaltonResolution), Mod(p[1], MaxHaltonResolution));
            for (int i = 0; i < 2; ++i) {
                uint64_t dimOffset =
                    (i == 0) ? InverseRadicalInverse(pm[i], 2, baseExponents[i])
                             : InverseRadicalInverse(pm[i], 3, baseExponents[i]);
                haltonIndex +=
                    dimOffset * (sampleStride / baseScales[i]) * multInverse[i];
            }
            haltonIndex %= sampleStride;
        }

        haltonIndex += sampleIndex * sampleStride;
        dimension = std::max(2, dim);
    }